

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int extraout_EAX;
  char *zMsg;
  unqlite_vm *pVm;
  unqlite *pDb;
  char *zBuf;
  int iLen;
  
  puts(
      "============================================================\nUnQLite (Via Jx9) Constant Expansion Mechanism              \n                                         http://unqlite.org/\n============================================================\n"
      );
  iVar1 = unqlite_open(&pDb,":mem:",4);
  if (iVar1 == 0) {
    iVar1 = unqlite_compile(pDb,
                            "print \'__PI__   value: \' .. __PI__ ..   JX9_EOL;print \'__TIME__ value: \' .. __TIME__ .. JX9_EOL;print \'__OS__   value: \' .. __OS__ ..   JX9_EOL;"
                            ,0x90,&pVm);
    if (iVar1 != 0) {
      unqlite_config(pDb,1,&zBuf,&iLen);
      if (0 < iLen) {
        puts(zBuf);
      }
      zMsg = "Jx9 compile error";
      goto LAB_0010a632;
    }
    iVar1 = unqlite_create_constant(pVm,"__PI__",PI_Constant,(void *)0x0);
    if (iVar1 != 0) {
      zMsg = "Error while installing the __PI__ constant";
      goto LAB_0010a632;
    }
    iVar1 = unqlite_create_constant(pVm,"__TIME__",TIME_Constant,(void *)0x0);
    if (iVar1 != 0) {
      zMsg = "Error while installing the __TIME__ constant";
      goto LAB_0010a632;
    }
    iVar1 = unqlite_create_constant(pVm,"__OS__",OS_Constant,(void *)0x0);
    if (iVar1 != 0) {
      zMsg = "Error while installing the __OS__ constant";
      goto LAB_0010a632;
    }
    iVar1 = unqlite_vm_config(pVm,1,VmOutputConsumer,0);
    if (iVar1 == 0) {
      iVar1 = unqlite_vm_exec(pVm);
      if (iVar1 == 0) {
        unqlite_vm_release(pVm);
        unqlite_close(pDb);
        return 0;
      }
    }
    Fatal(pDb,(char *)0x0);
  }
  zMsg = "Out of memory";
LAB_0010a632:
  Fatal((unqlite *)0x0,zMsg);
  return extraout_EAX;
}

Assistant:

int main(void)
{
	unqlite *pDb;       /* Database handle */
	unqlite_vm *pVm;    /* UnQLite VM resulting from successful compilation of the target Jx9 script */
	int rc;

	puts(zBanner);

	/* Open our database */
	rc = unqlite_open(&pDb,":mem:" /* In-mem DB */,UNQLITE_OPEN_CREATE);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Out of memory");
	}
	
	/* Compile our Jx9 script defined above */
	rc = unqlite_compile(pDb,JX9_PROG,sizeof(JX9_PROG)-1,&pVm);
	if( rc != UNQLITE_OK ){
		/* Compile error, extract the compiler error log */
		const char *zBuf;
		int iLen;
		/* Extract error log */
		unqlite_config(pDb,UNQLITE_CONFIG_JX9_ERR_LOG,&zBuf,&iLen);
		if( iLen > 0 ){
			puts(zBuf);
		}
		Fatal(0,"Jx9 compile error");
	}

	/* Now we have our program compiled, it's time to register our constants
	 * and their associated C procedure.
	 */
	rc = unqlite_create_constant(pVm, "__PI__", PI_Constant, 0);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Error while installing the __PI__ constant");
	}
	
	rc = unqlite_create_constant(pVm, "__TIME__", TIME_Constant, 0);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Error while installing the __TIME__ constant");
	}
	
	rc = unqlite_create_constant(pVm, "__OS__", OS_Constant, 0);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Error while installing the __OS__ constant");
	}

	/* Install a VM output consumer callback */
	rc = unqlite_vm_config(pVm,UNQLITE_VM_CONFIG_OUTPUT,VmOutputConsumer,0);
	if( rc != UNQLITE_OK ){
		Fatal(pDb,0);
	}
	
	/* Execute our script */
	rc = unqlite_vm_exec(pVm);
	if( rc != UNQLITE_OK ){
		Fatal(pDb,0);
	}

	/* Release our VM */
	unqlite_vm_release(pVm);
	
	/* Auto-commit the transaction and close our database */
	unqlite_close(pDb);
	return 0;
}